

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::TextureSizeCase::testTextureSize(TextureSizeCase *this,TestSize *testSize)

{
  TextureType TVar1;
  code *pcVar2;
  GLenum GVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  TestContext *pTVar10;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  OutOfMemoryError *this_00;
  float *pfVar13;
  Enum<int,_2UL> EVar14;
  bool local_1539;
  MessageBuilder local_1538;
  MessageBuilder local_13b8;
  MessageBuilder local_1238;
  PixelBufferAccess local_10b8;
  undefined1 local_1090 [56];
  TextureFormat TStack_1058;
  Vec4 outputColor;
  undefined1 local_1040 [8];
  TextureLevel sample;
  float colorTolerance;
  Enum<int,_2UL> local_1000;
  MessageBuilder local_ff0;
  int local_e6c;
  int local_e68;
  int local_e64;
  MessageBuilder local_e60;
  MessageBuilder local_ce0;
  int local_b5c;
  int local_b58;
  int local_b54;
  MessageBuilder local_b50;
  undefined1 local_9cc [8];
  IVec3 expectedSize;
  MessageBuilder local_9b8;
  MessageBuilder local_838;
  int local_6b8;
  int local_6b4;
  MessageBuilder local_6b0;
  int local_52c;
  int local_528;
  int local_524;
  MessageBuilder local_520;
  MessageBuilder local_3a0;
  int local_220;
  int local_21c;
  int local_218 [4];
  MessageBuilder local_208;
  undefined4 local_88;
  int local_84;
  GLuint texId;
  int levels;
  int maxLevel;
  GLenum errorValue;
  bool success;
  bool is2DLodValid;
  undefined4 uStack_70;
  bool isSquare;
  GLenum textureTarget;
  GLint lodLoc;
  GLint sizeLoc;
  GLint samplerLoc;
  GLint positionLoc;
  Functions *gl;
  Vec4 triangle [3];
  TestSize *testSize_local;
  TextureSizeCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gl,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(triangle[0].m_data + 2),4.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(triangle[1].m_data + 2),-1.0,4.0,0.0,1.0);
  pRVar9 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar9->_vptr_RenderContext[3])();
  _samplerLoc = CONCAT44(extraout_var,iVar4);
  pcVar2 = *(code **)(_samplerLoc + 0x780);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  sizeLoc = (*pcVar2)(dVar5,"a_position");
  pcVar2 = *(code **)(_samplerLoc + 0xb48);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  lodLoc = (*pcVar2)(dVar5,"u_sampler");
  pcVar2 = *(code **)(_samplerLoc + 0xb48);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  textureTarget = (*pcVar2)(dVar5,"u_texSize");
  pcVar2 = *(code **)(_samplerLoc + 0xb48);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  uStack_70 = (*pcVar2)(dVar5);
  errorValue = getGLTextureTarget(this);
  iVar4 = tcu::Vector<int,_3>::x(&testSize->textureSize);
  iVar6 = tcu::Vector<int,_3>::y(&testSize->textureSize);
  maxLevel._3_1_ = iVar4 == iVar6;
  iVar4 = tcu::Vector<int,_3>::x(&testSize->textureSize);
  local_1539 = true;
  if (iVar4 >> ((char)testSize->lod + (char)testSize->lodBase & 0x1fU) == 0) {
    iVar4 = tcu::Vector<int,_3>::y(&testSize->textureSize);
    local_1539 = iVar4 >> ((char)testSize->lod + (char)testSize->lodBase & 0x1fU) != 0;
  }
  maxLevel._2_1_ = local_1539;
  maxLevel._1_1_ = 1;
  if (((this->m_textureSpec).type == TEXTURETYPE_CUBE_MAP) && ((maxLevel._3_1_ & 1) == 0)) {
    this_local._7_1_ = true;
  }
  else if (((this->m_textureSpec).type == TEXTURETYPE_2D) && (local_1539 == false)) {
    this_local._7_1_ = true;
  }
  else if (((this->m_textureSpec).type == TEXTURETYPE_2D_ARRAY) && (local_1539 == false)) {
    this_local._7_1_ = true;
  }
  else {
    pcVar2 = *(code **)(_samplerLoc + 0x1680);
    dVar5 = glu::ShaderProgram::getProgram(this->m_program);
    (*pcVar2)(dVar5);
    (**(code **)(_samplerLoc + 0x14f0))(lodLoc);
    (**(code **)(_samplerLoc + 0x1c0))(0x3f000000,0x3f000000,0x3f000000,0x3f800000);
    (**(code **)(_samplerLoc + 0x1a00))(0,0,1);
    (**(code **)(_samplerLoc + 0x19f0))(sizeLoc,4,0x1406,0,0,&gl);
    (**(code **)(_samplerLoc + 0x610))(sizeLoc);
    texId = testSize->lod + testSize->lodBase;
    local_84 = texId + 1;
    local_88 = 0;
    (**(code **)(_samplerLoc + 0x6f8))(1,&local_88);
    (**(code **)(_samplerLoc + 0xb8))(errorValue,local_88);
    (**(code **)(_samplerLoc + 0x1360))(errorValue,0x2801);
    (**(code **)(_samplerLoc + 0x1360))(errorValue,0x2800,0x2600);
    (**(code **)(_samplerLoc + 0x1360))(errorValue,0x813c,testSize->lodBase);
    TVar1 = (this->m_textureSpec).type;
    if (TVar1 < TEXTURETYPE_2D_ARRAY) {
      pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_6b0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_6b0,(char (*) [20])"Testing image size ");
      local_6b4 = tcu::Vector<int,_3>::x(&testSize->textureSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_6b4);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2a9098a);
      local_6b8 = tcu::Vector<int,_3>::y(&testSize->textureSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_6b8);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6b0);
      pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_838,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_838,(char (*) [6])"Lod: ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&testSize->lod);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [15])", base level: ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&testSize->lodBase);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_838);
      pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_9b8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_9b8,(char (*) [12])"Expecting: ");
      expectedSize.m_data[2] = tcu::Vector<int,_3>::x(&testSize->expectedSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,expectedSize.m_data + 2);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2a9098a);
      expectedSize.m_data[1] = tcu::Vector<int,_3>::y(&testSize->expectedSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,expectedSize.m_data + 1);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_9b8);
      (**(code **)(_samplerLoc + 0x1538))(textureTarget,1,&testSize->expectedSize);
      (**(code **)(_samplerLoc + 0x14f8))(uStack_70,1,&testSize->lod);
      GVar3 = errorValue;
      iVar4 = local_84;
      pcVar2 = *(code **)(_samplerLoc + 0x1380);
      dVar5 = (this->m_textureSpec).format;
      iVar6 = tcu::Vector<int,_3>::x(&testSize->textureSize);
      iVar7 = tcu::Vector<int,_3>::y(&testSize->textureSize);
      (*pcVar2)(GVar3,iVar4,dVar5,iVar6,iVar7);
    }
    else if (TVar1 == TEXTURETYPE_2D_ARRAY) {
      iVar4 = tcu::Vector<int,_3>::x(&testSize->expectedSize);
      iVar6 = tcu::Vector<int,_3>::y(&testSize->expectedSize);
      iVar7 = tcu::Vector<int,_3>::z(&testSize->textureSize);
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_9cc,iVar4,iVar6,iVar7);
      pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_b50,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_b50,(char (*) [20])"Testing image size ");
      local_b54 = tcu::Vector<int,_3>::x(&testSize->textureSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_b54);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2a9098a);
      local_b58 = tcu::Vector<int,_3>::y(&testSize->textureSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_b58);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [7])0x2b3bfb8);
      local_b5c = tcu::Vector<int,_3>::z(&testSize->textureSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_b5c);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [10])" layer(s)");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_b50);
      pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_ce0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_ce0,(char (*) [6])"Lod: ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&testSize->lod);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [15])", base level: ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&testSize->lodBase);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_ce0);
      pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_e60,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_e60,(char (*) [12])"Expecting: ");
      local_e64 = tcu::Vector<int,_3>::x(&testSize->expectedSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_e64);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2a9098a);
      local_e68 = tcu::Vector<int,_3>::y(&testSize->expectedSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_e68);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [6])0x2b82e30);
      local_e6c = tcu::Vector<int,_3>::z(&testSize->textureSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_e6c);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [10])" layer(s)");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_e60);
      (**(code **)(_samplerLoc + 0x1578))(textureTarget,1,local_9cc);
      (**(code **)(_samplerLoc + 0x14f8))(uStack_70,1,&testSize->lod);
      GVar3 = errorValue;
      iVar4 = local_84;
      pcVar2 = *(code **)(_samplerLoc + 0x1398);
      dVar5 = (this->m_textureSpec).format;
      iVar6 = tcu::Vector<int,_3>::x(&testSize->textureSize);
      iVar7 = tcu::Vector<int,_3>::y(&testSize->textureSize);
      iVar8 = tcu::Vector<int,_3>::z(&testSize->textureSize);
      (*pcVar2)(GVar3,iVar4,dVar5,iVar6,iVar7,iVar8);
    }
    else if (TVar1 == TEXTURETYPE_3D) {
      pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_208,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_208,(char (*) [20])"Testing image size ");
      local_218[0] = tcu::Vector<int,_3>::x(&testSize->textureSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_218);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2a9098a);
      local_21c = tcu::Vector<int,_3>::y(&testSize->textureSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_21c);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2a9098a);
      local_220 = tcu::Vector<int,_3>::z(&testSize->textureSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_220);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_208);
      pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_3a0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_3a0,(char (*) [6])"Lod: ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&testSize->lod);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [15])", base level: ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&testSize->lodBase);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3a0);
      pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_520,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_520,(char (*) [12])"Expecting: ");
      local_524 = tcu::Vector<int,_3>::x(&testSize->expectedSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_524);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2a9098a);
      local_528 = tcu::Vector<int,_3>::y(&testSize->expectedSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_528);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2a9098a);
      local_52c = tcu::Vector<int,_3>::z(&testSize->expectedSize);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_52c);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_520);
      (**(code **)(_samplerLoc + 0x1578))(textureTarget,1,&testSize->expectedSize);
      (**(code **)(_samplerLoc + 0x14f8))(uStack_70,1,&testSize->lod);
      GVar3 = errorValue;
      iVar4 = local_84;
      pcVar2 = *(code **)(_samplerLoc + 0x1398);
      dVar5 = (this->m_textureSpec).format;
      iVar6 = tcu::Vector<int,_3>::x(&testSize->textureSize);
      iVar7 = tcu::Vector<int,_3>::y(&testSize->textureSize);
      iVar8 = tcu::Vector<int,_3>::z(&testSize->textureSize);
      (*pcVar2)(GVar3,iVar4,dVar5,iVar6,iVar7,iVar8);
    }
    levels = (**(code **)(_samplerLoc + 0x800))();
    if (levels == 0x505) {
      this_00 = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
      glu::OutOfMemoryError::OutOfMemoryError
                (this_00,"Failed to allocate texture, got GL_OUT_OF_MEMORY.","TexStorageXD",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderTextureFunctionTests.cpp"
                 ,0x4be);
      __cxa_throw(this_00,&glu::OutOfMemoryError::typeinfo,glu::OutOfMemoryError::~OutOfMemoryError)
      ;
    }
    if (levels == 0) {
      sample.m_data.m_cap._4_4_ = 0x3dcccccd;
      tcu::TextureFormat::TextureFormat((TextureFormat *)(outputColor.m_data + 2),RGBA,UNORM_INT8);
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)local_1040,(TextureFormat *)(outputColor.m_data + 2),1,1,1);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&TStack_1058);
      (**(code **)(_samplerLoc + 0x188))(0x4000);
      (**(code **)(_samplerLoc + 0x538))(4,0,3);
      (**(code **)(_samplerLoc + 0x648))();
      pRVar9 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)(local_1090 + 0x10),(TextureLevel *)local_1040);
      glu::readPixels(pRVar9,0,0,(PixelBufferAccess *)(local_1090 + 0x10));
      tcu::TextureLevel::getAccess(&local_10b8,(TextureLevel *)local_1040);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_1090,(int)&local_10b8,0,0);
      TStack_1058.order = local_1090._0_4_;
      TStack_1058.type = local_1090._4_4_;
      outputColor.m_data[0] = (float)local_1090._8_4_;
      outputColor.m_data[1] = (float)local_1090._12_4_;
      pfVar13 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&TStack_1058);
      if (((*pfVar13 < 0.9) ||
          (pfVar13 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&TStack_1058), *pfVar13 < 0.9)) ||
         (pfVar13 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&TStack_1058), *pfVar13 < 0.9)) {
        pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
        pTVar11 = tcu::TestContext::getLog(pTVar10);
        tcu::TestLog::operator<<(&local_13b8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<(&local_13b8,(char (*) [7])"Failed");
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_13b8);
        maxLevel._1_1_ = 0;
      }
      else {
        pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
        pTVar11 = tcu::TestContext::getLog(pTVar10);
        tcu::TestLog::operator<<(&local_1238,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<(&local_1238,(char (*) [7])0x2c49ea1);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1238);
      }
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1040);
    }
    else {
      pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_ff0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_ff0,(char (*) [13])"Failed, got ");
      EVar14 = glu::getErrorStr(levels);
      local_1000.m_getName = EVar14.m_getName;
      local_1000.m_value = EVar14.m_value;
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_1000);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b6cb9a);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_ff0);
      maxLevel._1_1_ = 0;
    }
    pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
    pTVar11 = tcu::TestContext::getLog(pTVar10);
    tcu::TestLog::operator<<(&local_1538,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator<<(&local_1538,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1538);
    (**(code **)(_samplerLoc + 0xb8))(errorValue,0);
    (**(code **)(_samplerLoc + 0x480))(1,&local_88);
    (**(code **)(_samplerLoc + 0x1680))(0);
    this_local._7_1_ = (bool)(maxLevel._1_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool TextureSizeCase::testTextureSize (const TestSize& testSize)
{
	using tcu::TestLog;

	const tcu::Vec4 triangle[3] = // covers entire viewport
	{
		tcu::Vec4(-1, -1, 0, 1),
		tcu::Vec4( 4, -1, 0, 1),
		tcu::Vec4(-1,  4, 0, 1),
	};

	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();

	const glw::GLint		positionLoc		= gl.getAttribLocation	(m_program->getProgram(), "a_position");
	const glw::GLint		samplerLoc		= gl.getUniformLocation	(m_program->getProgram(), "u_sampler");
	const glw::GLint		sizeLoc			= gl.getUniformLocation	(m_program->getProgram(), "u_texSize");
	const glw::GLint		lodLoc			= gl.getUniformLocation	(m_program->getProgram(), "u_lod");
	const glw::GLenum		textureTarget	= getGLTextureTarget	();
	const bool				isSquare		= testSize.textureSize.x() == testSize.textureSize.y();
	const bool				is2DLodValid	= (testSize.textureSize.x() >> (testSize.lod + testSize.lodBase)) != 0 || (testSize.textureSize.y() >> (testSize.lod + testSize.lodBase)) != 0;
	bool					success			= true;
	glw::GLenum				errorValue;

	// Skip incompatible cases
	if (m_textureSpec.type == TEXTURETYPE_CUBE_MAP && !isSquare)
		return true;
	if (m_textureSpec.type == TEXTURETYPE_2D && !is2DLodValid)
		return true;
	if (m_textureSpec.type == TEXTURETYPE_2D_ARRAY && !is2DLodValid)
		return true;

	// setup rendering

	gl.useProgram				(m_program->getProgram());
	gl.uniform1i				(samplerLoc, 0);
	gl.clearColor				(0.5f, 0.5f, 0.5f, 1.0f);
	gl.viewport					(0, 0, 1, 1);
	gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);
	gl.enableVertexAttribArray	(positionLoc);

	// setup texture
	{
		const int	maxLevel	= testSize.lod + testSize.lodBase;
		const int	levels		= maxLevel + 1;
		glw::GLuint texId		= 0;

		// gen texture
		gl.genTextures(1, &texId);
		gl.bindTexture(textureTarget, texId);
		gl.texParameteri(textureTarget, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(textureTarget, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(textureTarget, GL_TEXTURE_BASE_LEVEL, testSize.lodBase);

		// set up texture

		switch (m_textureSpec.type)
		{
			case TEXTURETYPE_3D:
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Testing image size " << testSize.textureSize.x() << "x" << testSize.textureSize.y() << "x" << testSize.textureSize.z() << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Lod: " << testSize.lod << ", base level: " << testSize.lodBase << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Expecting: " << testSize.expectedSize.x() << "x" << testSize.expectedSize.y() << "x" << testSize.expectedSize.z() << TestLog::EndMessage;

				gl.uniform3iv(sizeLoc, 1, testSize.expectedSize.m_data);
				gl.uniform1iv(lodLoc,  1, &testSize.lod);

				gl.texStorage3D(textureTarget, levels, m_textureSpec.format, testSize.textureSize.x(), testSize.textureSize.y(), testSize.textureSize.z());
				break;
			}

			case TEXTURETYPE_2D:
			case TEXTURETYPE_CUBE_MAP:
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Testing image size " << testSize.textureSize.x() << "x" << testSize.textureSize.y() << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Lod: " << testSize.lod << ", base level: " << testSize.lodBase << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Expecting: " << testSize.expectedSize.x() << "x" << testSize.expectedSize.y() << TestLog::EndMessage;

				gl.uniform2iv(sizeLoc, 1, testSize.expectedSize.m_data);
				gl.uniform1iv(lodLoc,  1, &testSize.lod);

				gl.texStorage2D(textureTarget, levels, m_textureSpec.format, testSize.textureSize.x(), testSize.textureSize.y());
				break;
			}

			case TEXTURETYPE_2D_ARRAY:
			{
				tcu::IVec3 expectedSize(testSize.expectedSize.x(), testSize.expectedSize.y(), testSize.textureSize.z());

				m_context.getTestContext().getLog() << TestLog::Message << "Testing image size " << testSize.textureSize.x() << "x" << testSize.textureSize.y() << " with " << testSize.textureSize.z() << " layer(s)" << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Lod: " << testSize.lod << ", base level: " << testSize.lodBase << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Expecting: " << testSize.expectedSize.x() << "x" << testSize.expectedSize.y() << " and " << testSize.textureSize.z() << " layer(s)" << TestLog::EndMessage;

				gl.uniform3iv(sizeLoc, 1, expectedSize.m_data);
				gl.uniform1iv(lodLoc,  1, &testSize.lod);

				gl.texStorage3D(textureTarget, levels, m_textureSpec.format, testSize.textureSize.x(), testSize.textureSize.y(), testSize.textureSize.z());
				break;
			}

			default:
			{
				DE_ASSERT(false);
				break;
			}
		}

		errorValue = gl.getError();
		if (errorValue == GL_OUT_OF_MEMORY)
		{
			throw glu::OutOfMemoryError("Failed to allocate texture, got GL_OUT_OF_MEMORY.", "TexStorageXD", __FILE__, __LINE__);
		}
		else if (errorValue != GL_NO_ERROR)
		{
			// error is a failure too
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Failed, got " << glu::getErrorStr(errorValue) << "." << tcu::TestLog::EndMessage;
			success = false;
		}
		else
		{
			// test
			const float			colorTolerance = 0.1f;
			tcu::TextureLevel	sample			(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1);
			tcu::Vec4			outputColor;

			gl.clear			(GL_COLOR_BUFFER_BIT);
			gl.drawArrays		(GL_TRIANGLES, 0, 3);
			gl.finish			();

			glu::readPixels		(m_context.getRenderContext(), 0, 0, sample.getAccess());

			outputColor = sample.getAccess().getPixel(0, 0);

			if (outputColor.x() >= 1.0f - colorTolerance &&
				outputColor.y() >= 1.0f - colorTolerance &&
				outputColor.z() >= 1.0f - colorTolerance)
			{
				// success
				m_context.getTestContext().getLog() << TestLog::Message << "Passed" << TestLog::EndMessage;
			}
			else
			{
				// failure
				m_context.getTestContext().getLog() << TestLog::Message << "Failed" << TestLog::EndMessage;
				success = false;
			}
		}

		// empty line to format log nicely
		m_context.getTestContext().getLog() << TestLog::Message << TestLog::EndMessage;

		// free
		gl.bindTexture		(textureTarget, 0);
		gl.deleteTextures	(1, &texId);
	}

	gl.useProgram(0);

	return success;
}